

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O0

int64_t __thiscall
aeron::ClientConductor::addCounter
          (ClientConductor *this,int32_t typeId,uint8_t *keyBuffer,size_t keyLength,string *label)

{
  IllegalArgumentException *pIVar1;
  char *pcVar2;
  ulong uVar3;
  vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
  *pvVar4;
  longlong *__args_1;
  long *__args;
  ulong in_RCX;
  long in_RDI;
  int64_t registrationId;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_fffffffffffffe28;
  lock_guard<std::recursive_mutex> *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
  *this_00;
  string *in_stack_fffffffffffffe60;
  unsigned_long in_stack_fffffffffffffe68;
  allocator *paVar5;
  uint8_t *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  int32_t typeId_00;
  DriverProxy *in_stack_fffffffffffffe80;
  allocator local_151;
  string local_150;
  ClientConductor *in_stack_fffffffffffffed0;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  ulong local_20;
  
  typeId_00 = (int32_t)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  local_20 = in_RCX;
  verifyDriverIsActive(in_stack_fffffffffffffed0);
  ensureOpen(in_stack_fffffffffffffed0);
  if (0x70 < local_20) {
    local_c2 = 1;
    pIVar1 = (IllegalArgumentException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(in_stack_fffffffffffffe68);
    std::operator+(&local_48,"key length out of bounds: ",&local_68);
    paVar5 = &local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_98,
               "std::int64_t aeron::ClientConductor::addCounter(std::int32_t, const std::uint8_t *, std::size_t, const std::string &)"
               ,paVar5);
    pcVar2 = util::past_prefix(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    paVar5 = &local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c0,pcVar2,paVar5);
    util::IllegalArgumentException::IllegalArgumentException
              (pIVar1,&local_48,&local_98,&local_c0,0x142);
    local_c2 = 0;
    __cxa_throw(pIVar1,&util::IllegalArgumentException::typeinfo,
                util::IllegalArgumentException::~IllegalArgumentException);
  }
  uVar3 = std::__cxx11::string::length();
  if (0x17c < uVar3) {
    pIVar1 = (IllegalArgumentException *)__cxa_allocate_exception(0x48);
    std::__cxx11::string::length();
    std::__cxx11::to_string(in_stack_fffffffffffffe68);
    std::operator+(&local_e8,"label length out of bounds: ",&local_108);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_128,
               "std::int64_t aeron::ClientConductor::addCounter(std::int32_t, const std::uint8_t *, std::size_t, const std::string &)"
               ,(allocator *)&stack0xfffffffffffffed7);
    pcVar2 = util::past_prefix(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_150,pcVar2,&local_151);
    util::IllegalArgumentException::IllegalArgumentException
              (pIVar1,&local_e8,&local_128,&local_150,0x147);
    __cxa_throw(pIVar1,&util::IllegalArgumentException::typeinfo,
                util::IllegalArgumentException::~IllegalArgumentException);
  }
  std::lock_guard<std::recursive_mutex>::lock_guard
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  pvVar4 = (vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
            *)DriverProxy::addCounter
                        (in_stack_fffffffffffffe80,typeId_00,in_stack_fffffffffffffe70,
                         in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  __args_1 = (longlong *)(in_RDI + 0x78);
  this_00 = pvVar4;
  __args = (long *)std::function<long_long_()>::operator()
                             ((function<long_long_()> *)(in_RDI + 0x1d8));
  std::
  vector<aeron::ClientConductor::CounterStateDefn,std::allocator<aeron::ClientConductor::CounterStateDefn>>
  ::emplace_back<long&,long_long>(this_00,__args,__args_1);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1cc111);
  return (int64_t)pvVar4;
}

Assistant:

std::int64_t ClientConductor::addCounter(
    std::int32_t typeId, const std::uint8_t *keyBuffer, std::size_t keyLength, const std::string& label)
{
    verifyDriverIsActive();
    ensureOpen();

    if (keyLength > CountersManager::MAX_KEY_LENGTH)
    {
        throw IllegalArgumentException("key length out of bounds: " + std::to_string(keyLength), SOURCEINFO);
    }

    if (label.length() > CountersManager::MAX_LABEL_LENGTH)
    {
        throw IllegalArgumentException("label length out of bounds: " + std::to_string(label.length()), SOURCEINFO);
    }

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    std::int64_t registrationId = m_driverProxy.addCounter(typeId, keyBuffer, keyLength, label);

    m_counters.emplace_back(registrationId, m_epochClock());

    return registrationId;
}